

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::Autotune::printSkippedArgs(Autotune *this,Args *autotuneArgs)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference pbVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end1;
  iterator __begin1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsToCheck;
  string *argName;
  Args *in_stack_fffffffffffffd40;
  key_equal *in_stack_fffffffffffffd48;
  hasher *in_stack_fffffffffffffd50;
  size_type in_stack_fffffffffffffd58;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd60;
  iterator in_stack_fffffffffffffd68;
  size_type in_stack_fffffffffffffd70;
  allocator_type *in_stack_fffffffffffffd80;
  string *local_260;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b0;
  undefined1 *local_1a8;
  string local_1a0 [3];
  undefined1 local_19d;
  allocator local_19c;
  allocator local_19b;
  allocator local_19a;
  allocator local_199;
  allocator local_198;
  allocator local_197;
  allocator local_196;
  allocator local_195 [20];
  allocator local_181;
  string *local_180;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string *local_58;
  undefined8 local_50;
  undefined1 local_48 [72];
  
  local_19d = 1;
  local_180 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"epoch",&local_181);
  local_180 = local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"lr",local_195);
  local_180 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"dim",&local_196);
  local_180 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"wordNgrams",&local_197);
  local_180 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"loss",&local_198);
  local_180 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"bucket",&local_199);
  local_180 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"minn",&local_19a);
  local_180 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"maxn",&local_19b);
  local_180 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"dsub",&local_19c);
  local_19d = 0;
  local_58 = local_178;
  local_50 = 9;
  argName = local_1a0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x18edb2);
  __l._M_len = in_stack_fffffffffffffd70;
  __l._M_array = in_stack_fffffffffffffd68;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(in_stack_fffffffffffffd60,__l,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                  in_stack_fffffffffffffd48,in_stack_fffffffffffffd80);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x18edfd);
  local_260 = (string *)&local_58;
  do {
    local_260 = local_260 + -0x20;
    std::__cxx11::string::~string(local_260);
  } while (local_260 != local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_19c);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b);
  std::allocator<char>::~allocator((allocator<char> *)&local_19a);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::~allocator((allocator<char> *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_197);
  std::allocator<char>::~allocator((allocator<char> *)&local_196);
  std::allocator<char>::~allocator((allocator<char> *)local_195);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  local_1a8 = local_48;
  local_1b0._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)argName);
  local_1b8._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)argName);
  while (bVar1 = std::__detail::operator!=(&local_1b0,&local_1b8), bVar1) {
    pbVar2 = std::__detail::
             _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
             ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                          *)0x18ef16);
    bVar1 = Args::isManual(in_stack_fffffffffffffd40,argName);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Warning : ");
      poVar3 = std::operator<<(poVar3,(string *)pbVar2);
      poVar3 = std::operator<<(poVar3," is manually set to a specific value. ");
      poVar3 = std::operator<<(poVar3,"It will not be automatically optimized.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::__detail::
    _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)in_stack_fffffffffffffd40);
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x18f20e);
  return;
}

Assistant:

void Autotune::printSkippedArgs(const Args& autotuneArgs) {
  std::unordered_set<std::string> argsToCheck = {"epoch",
                                                 "lr",
                                                 "dim",
                                                 "wordNgrams",
                                                 "loss",
                                                 "bucket",
                                                 "minn",
                                                 "maxn",
                                                 "dsub"};
  for (const auto& arg : argsToCheck) {
    if (autotuneArgs.isManual(arg)) {
      std::cerr << "Warning : " << arg
                << " is manually set to a specific value. "
                << "It will not be automatically optimized." << std::endl;
    }
  }
}